

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srtStreamReader.cpp
# Opt level: O0

int __thiscall SRTStreamReader::readPacket(SRTStreamReader *this,AVPacket *avPacket)

{
  AbstractStreamReader *pAVar1;
  uint8_t *puVar2;
  bool local_39;
  uint8_t *renderedBuffer;
  uint32_t renderedLen;
  int rez;
  AVPacket *avPacket_local;
  SRTStreamReader *this_local;
  
  _renderedLen = avPacket;
  avPacket_local = (AVPacket *)this;
  renderedBuffer._4_4_ =
       (*(this->m_dstSubCodec->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader[6])
                 (this->m_dstSubCodec,avPacket);
  this_local._4_4_ = renderedBuffer._4_4_;
  if (renderedBuffer._4_4_ == 1) {
    puVar2 = renderNextMessage(this,(uint32_t *)&renderedBuffer);
    if (puVar2 == (uint8_t *)0x0) {
      this_local._4_4_ = 1;
    }
    else {
      pAVar1 = this->m_dstSubCodec;
      local_39 = false;
      if ((this->m_lastBlock & 1U) != 0) {
        local_39 = std::
                   queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::empty(&this->m_sourceText);
      }
      (*(pAVar1->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader[4])
                (pAVar1,puVar2 + -0x8000,(ulong)(uint)renderedBuffer,(ulong)local_39);
      this_local._4_4_ =
           (*(this->m_dstSubCodec->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader[6]
           )(this->m_dstSubCodec,_renderedLen);
    }
  }
  return this_local._4_4_;
}

Assistant:

int SRTStreamReader::readPacket(AVPacket& avPacket)
{
    const int rez = m_dstSubCodec->readPacket(avPacket);
    if (rez == NEED_MORE_DATA)
    {
        uint32_t renderedLen;
        uint8_t* renderedBuffer = renderNextMessage(renderedLen);
        if (renderedBuffer)
        {
            m_dstSubCodec->setBuffer(renderedBuffer - MAX_AV_PACKET_SIZE, renderedLen,
                                     m_lastBlock && m_sourceText.empty());
            return m_dstSubCodec->readPacket(avPacket);
        }
        return NEED_MORE_DATA;
    }
    return rez;
}